

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

bool fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned_long,char>
               (appender *out,unsigned_long value,uint prefix,basic_format_specs<char> *specs,
               locale_ref loc)

{
  char cVar1;
  locale_ref loc_00;
  appender out_00;
  bool bVar2;
  bool bVar3;
  char cVar4;
  char *pcVar5;
  reference pcVar6;
  char *__first;
  size_t sVar7;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> this;
  int in_EDX;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> *in_RDI;
  char *data;
  int i;
  char *p;
  int digit_index;
  basic_string_view<char> s;
  type usize;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  char digits [40];
  const_iterator group;
  string *groups;
  int n;
  int size;
  int num_digits;
  thousands_sep_result<char> ts;
  int sep_size;
  allocator<char> *in_stack_fffffffffffffc28;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  basic_string_view<char> *in_stack_fffffffffffffc38;
  char *in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  anon_class_16_2_3f014a30 *in_stack_fffffffffffffca8;
  size_t in_stack_fffffffffffffcb8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  int iVar8;
  char *local_330;
  int local_31c;
  basic_string_view<char> local_318;
  type local_308;
  allocator<char> local_301;
  buffer<char> local_300 [2];
  uint64_t in_stack_fffffffffffffd50;
  char local_d8 [48];
  undefined8 local_a8;
  undefined8 local_90;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  undefined1 *local_80;
  int local_78;
  int local_74;
  int local_70;
  undefined4 local_6c;
  undefined1 local_60 [32];
  char local_40 [12];
  undefined4 local_34;
  int local_24;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> *local_18;
  byte local_1;
  
  local_34 = 1;
  loc_00.locale_._4_4_ = in_stack_fffffffffffffc7c;
  loc_00.locale_._0_4_ = in_stack_fffffffffffffc78;
  local_24 = in_EDX;
  local_18 = in_RDI;
  thousands_sep<char>(loc_00);
  if (local_40[0] == '\0') {
    local_1 = 0;
    local_6c = 1;
  }
  else {
    local_78 = count_digits(in_stack_fffffffffffffd50);
    local_80 = local_60;
    local_74 = local_78;
    local_70 = local_78;
    local_88._M_current = (char *)std::__cxx11::string::cbegin();
    while( true ) {
      local_90 = std::__cxx11::string::cend();
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffc30,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffc28);
      iVar8 = local_78;
      bVar3 = false;
      if (bVar2) {
        pcVar6 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_88);
        bVar3 = false;
        if (*pcVar6 < iVar8) {
          pcVar6 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_88);
          bVar3 = false;
          if ('\0' < *pcVar6) {
            pcVar6 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_88);
            cVar1 = *pcVar6;
            cVar4 = max_value<char>();
            bVar3 = cVar1 != cVar4;
          }
        }
      }
      if (!bVar3) break;
      local_74 = local_74 + 1;
      pcVar6 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_88);
      local_78 = local_78 - *pcVar6;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_88);
    }
    local_a8 = std::__cxx11::string::cend();
    bVar3 = __gnu_cxx::operator==
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffc30,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffc28);
    if (bVar3) {
      iVar8 = local_78 + -1;
      pcVar5 = (char *)std::__cxx11::string::back();
      local_74 = iVar8 / (int)*pcVar5 + local_74;
    }
    format_decimal<char,unsigned_long>
              (in_stack_fffffffffffffc40,(unsigned_long)in_stack_fffffffffffffc38,
               (int)((ulong)in_stack_fffffffffffffc30 >> 0x20));
    std::allocator<char>::allocator();
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    std::allocator<char>::~allocator(&local_301);
    if (local_24 != 0) {
      local_74 = local_74 + 1;
    }
    local_308 = to_unsigned<int>(0);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::resize
              (in_stack_fffffffffffffc30,(size_t)in_stack_fffffffffffffc28);
    basic_string_view<char>::basic_string_view(&local_318,local_40,1);
    local_31c = 0;
    local_88._M_current = (char *)std::__cxx11::string::cbegin();
    pcVar5 = buffer<char>::data(local_300);
    local_330 = pcVar5 + (long)local_74 + -1;
    iVar8 = local_70;
    while (iVar8 = iVar8 + -1, 0 < iVar8) {
      pcVar5 = local_330 + -1;
      *local_330 = local_d8[iVar8];
      pcVar6 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_88);
      local_330 = pcVar5;
      if ('\0' < *pcVar6) {
        local_31c = local_31c + 1;
        pcVar6 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_88);
        if (local_31c % (int)*pcVar6 == 0) {
          pcVar6 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_88);
          cVar1 = *pcVar6;
          cVar4 = max_value<char>();
          if (cVar1 != cVar4) {
            in_stack_fffffffffffffcc0 =
                 __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffffc38,(difference_type)in_stack_fffffffffffffc30
                            );
            in_stack_fffffffffffffcb8 = std::__cxx11::string::cend();
            bVar3 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_fffffffffffffc30,
                               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_fffffffffffffc28);
            if (bVar3) {
              local_31c = 0;
              __gnu_cxx::
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator++(&local_88);
            }
            in_stack_fffffffffffffc38 = &local_318;
            basic_string_view<char>::data(in_stack_fffffffffffffc38);
            __first = basic_string_view<char>::data(in_stack_fffffffffffffc38);
            basic_string_view<char>::size(in_stack_fffffffffffffc38);
            sVar7 = basic_string_view<char>::size(in_stack_fffffffffffffc38);
            make_checked<char>(pcVar5,sVar7);
            std::uninitialized_copy<char_const*,char*>
                      (__first,(char *)in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30);
            sVar7 = basic_string_view<char>::size(&local_318);
            local_330 = pcVar5 + -sVar7;
          }
        }
      }
    }
    *local_330 = local_d8[0];
    if (local_24 != 0) {
      local_330[-1] = (char)local_24;
    }
    pcVar5 = buffer<char>::data(local_300);
    out_00.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ = iVar8;
    out_00.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_ =
         in_stack_fffffffffffffcc8;
    this.container =
         (buffer<char> *)
         write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned_long,char>(fmt::v8::appender&,unsigned_long,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_>
                   (out_00,(basic_format_specs<char> *)in_stack_fffffffffffffcc0._M_current,
                    in_stack_fffffffffffffcb8,(size_t)pcVar5,in_stack_fffffffffffffca8);
    local_18->container = this.container;
    local_1 = 1;
    local_6c = 1;
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)this.container);
  }
  thousands_sep_result<char>::~thousands_sep_result((thousands_sep_result<char> *)0x12240f);
  return (bool)(local_1 & 1);
}

Assistant:

auto write_int_localized(OutputIt& out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs, locale_ref loc)
    -> bool {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  const auto sep_size = 1;
  auto ts = thousands_sep<Char>(loc);
  if (!ts.thousands_sep) return false;
  int num_digits = count_digits(value);
  int size = num_digits, n = num_digits;
  const std::string& groups = ts.grouping;
  std::string::const_iterator group = groups.cbegin();
  while (group != groups.cend() && n > *group && *group > 0 &&
         *group != max_value<char>()) {
    size += sep_size;
    n -= *group;
    ++group;
  }
  if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
  char digits[40];
  format_decimal(digits, value, num_digits);
  basic_memory_buffer<Char> buffer;
  if (prefix != 0) ++size;
  const auto usize = to_unsigned(size);
  buffer.resize(usize);
  basic_string_view<Char> s(&ts.thousands_sep, sep_size);
  // Index of a decimal digit with the least significant digit having index 0.
  int digit_index = 0;
  group = groups.cbegin();
  auto p = buffer.data() + size - 1;
  for (int i = num_digits - 1; i > 0; --i) {
    *p-- = static_cast<Char>(digits[i]);
    if (*group <= 0 || ++digit_index % *group != 0 ||
        *group == max_value<char>())
      continue;
    if (group + 1 != groups.cend()) {
      digit_index = 0;
      ++group;
    }
    std::uninitialized_copy(s.data(), s.data() + s.size(),
                            make_checked(p, s.size()));
    p -= s.size();
  }
  *p-- = static_cast<Char>(*digits);
  if (prefix != 0) *p = static_cast<Char>(prefix);
  auto data = buffer.data();
  out = write_padded<align::right>(
      out, specs, usize, usize, [=](reserve_iterator<OutputIt> it) {
        return copy_str<Char>(data, data + size, it);
      });
  return true;
}